

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

intvector sptk::swipe::zeroiv(int xSz)

{
  int *piVar1;
  intvector iVar2;
  
  piVar1 = (int *)calloc(4,(long)xSz);
  iVar2._4_4_ = 0;
  iVar2.x = xSz;
  iVar2.v = piVar1;
  return iVar2;
}

Assistant:

intvector zeroiv(int xSz) {
    intvector nw_vector;
    nw_vector.x = xSz;
#if 0
    nw_vector.v = calloc(sizeof(int), xSz);
#else
    nw_vector.v = (int*) calloc(sizeof(int), xSz);
#endif
    return(nw_vector);
}